

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O2

UniValue * __thiscall
GenerateToAddressRequestHandler::PrepareRequest
          (UniValue *__return_storage_ptr__,GenerateToAddressRequestHandler *this,string *method,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  long lVar1;
  const_reference __str;
  long in_FS_OFFSET;
  int local_f8;
  allocator<char> local_f1;
  UniValue local_f0;
  string local_98;
  UniValue params;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(args,1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->address_str,__str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"generatetoaddress",(allocator<char> *)&local_98);
  RPCConvertValues(&params,(string *)&local_f0,args);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"generatetoaddress",&local_f1);
  local_f8 = 1;
  UniValue::UniValue<int,_int,_true>(&local_f0,&local_f8);
  JSONRPCRequestObj(__return_storage_ptr__,&local_98,&params,&local_f0);
  UniValue::~UniValue(&local_f0);
  std::__cxx11::string::~string((string *)&local_98);
  UniValue::~UniValue(&params);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue PrepareRequest(const std::string& method, const std::vector<std::string>& args) override
    {
        address_str = args.at(1);
        UniValue params{RPCConvertValues("generatetoaddress", args)};
        return JSONRPCRequestObj("generatetoaddress", params, 1);
    }